

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split<char>(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *__return_storage_ptr__,
             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,string *delim,
             uint limit)

{
  char *pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type local_50;
  ulong local_48;
  string *local_40;
  uint local_38;
  undefined4 local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = delim->_M_string_length;
  if (local_50 == 0) {
    return __return_storage_ptr__;
  }
  if (local_50 == 1) {
    pcVar1 = (delim->_M_dataplus)._M_p;
    local_34 = (undefined4)CONCAT71((int7)((ulong)pcVar1 >> 8),*pcVar1 == '\n');
  }
  else {
    local_34 = 0;
  }
  local_48 = (ulong)limit;
  local_40 = delim;
  local_38 = limit;
  do {
    lVar2 = std::__cxx11::string::find((string *)s,(ulong)local_40);
    if (local_38 == 0) {
      if (lVar2 == -1) {
LAB_0016c32c:
        std::__cxx11::string::substr((ulong)&local_70,(ulong)s);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        return __return_storage_ptr__;
      }
    }
    else if ((lVar2 == -1) ||
            ((long)(__return_storage_ptr__->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5 == local_48)) goto LAB_0016c32c;
    std::__cxx11::string::substr((ulong)&local_70,(ulong)s);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  } while( true );
}

Assistant:

std::vector<std::basic_string<C>> split(const std::basic_string<C>& s,
                                        const std::string& delim = " ",
                                        unsigned limit = 0)
{
    std::vector<std::basic_string<C>> args;
    auto l = delim.length();
    if (l == 0)
        return args;
    unsigned pos = 0;
    bool crlf = (delim.size() == 1 && delim[0] == 10);
    while (true) {
        auto newpos = s.find(delim, pos);
        if ((limit && args.size() == limit) || newpos == std::string::npos) {
            args.push_back(s.substr(pos));
            break;
        }
        args.push_back(s.substr(pos, newpos - pos));
        pos = newpos + l;
        if (crlf && pos < s.length() && s[pos] == 13)
            pos++;
    }

    return args;
}